

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

int __thiscall Clasp::ClaspFacade::SolveData::init(SolveData *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Enumerator *e;
  SolveAlgorithm *pSVar2;
  Enumerator *in_stack_ffffffffffffffd8;
  
  SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator=
            (&this->en,in_stack_ffffffffffffffd8);
  SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::operator=
            ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)this,
             (SolveAlgorithm *)in_stack_ffffffffffffffd8);
  e = (Enumerator *)
      SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x1222f8);
  SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator*
            ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x122306);
  SolveAlgorithm::setEnumerator((SolveAlgorithm *)this,e);
  if (((ulong)((SolveAlgorithm *)this)->time_ & 0x100000000000000) != 0) {
    pSVar2 = SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x12232b);
    uVar1 = (*pSVar2->_vptr_SolveAlgorithm[4])();
    this = (SolveData *)(ulong)uVar1;
  }
  return (int)this;
}

Assistant:

void ClaspFacade::SolveData::init(SolveAlgorithm* a, Enumerator* e) {
	en = e;
	algo = a;
	algo->setEnumerator(*en);
	if (interruptible) {
		this->algo->enableInterrupts();
	}
}